

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::concat
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementSize elementSize,StructSize structSize,ArrayPtr<const_capnp::_::ListReader> lists)

{
  ListElementCount LVar1;
  PointerReader other;
  StructReader other_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  unsigned_long uVar8;
  byte bVar9;
  uint uVar10;
  ListReader *pLVar11;
  word *pwVar12;
  ListReader *list;
  uint uVar13;
  ListReader *list_3;
  ListReader *pLVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  word *pwVar19;
  uint i_1;
  ElementCount index;
  uint i_2;
  bool bVar20;
  AllocateResult AVar21;
  Exception *local_d8;
  ListReader *__end3;
  Fault f;
  undefined4 uStack_6c;
  StructReader local_60;
  
  uVar17 = (ulong)(uint)structSize;
  if (lists.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xd5a,FAILED,"lists.size() > 0","\"Can\'t concat empty list \"",
               (char (*) [25])"Can\'t concat empty list ");
    kj::_::Debug::Fault::fatal(&f);
  }
  uVar15 = (uint)structSize >> 0x10;
  lVar7 = lists.size_ * 0x30;
  pLVar14 = lists.ptr + lists.size_;
  uVar16 = 0;
  pLVar11 = lists.ptr;
  while( true ) {
    uVar18 = uVar17 & 0xffff;
    if (lVar7 == 0) {
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      __return_storage_ptr__->location = (word *)0x0;
      (__return_storage_ptr__->tag).content = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      if (elementSize == INLINE_COMPOSITE) {
        uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                           (uVar16,(anon_class_1_0_00000001 *)&f);
        uVar8 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                          ((ulong)(uVar15 + (int)uVar18) * (ulong)uVar16,
                           (anon_class_1_0_00000001 *)&f);
        uVar13 = (int)uVar8 + 1;
        if (arena == (BuilderArena *)0x0) {
          if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
              (int)(__return_storage_ptr__->tag).content != 0) {
            WireHelpers::zeroObject
                      ((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
          }
          iVar6 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = _DAT_00000028;
          AVar21 = (AllocateResult)(auVar3 << 0x40);
          _DAT_00000028 = _DAT_00000028 + (ulong)uVar13 * 8;
        }
        else {
          AVar21 = BuilderArena::allocate(arena,uVar13);
          iVar6 = -3;
        }
        pwVar12 = AVar21.words;
        local_d8 = (Exception *)AVar21.segment;
        *(int *)&(__return_storage_ptr__->tag).content = iVar6;
        *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = (int)uVar8 * 8 + 7;
        *(uint *)&pwVar12->content = uVar16 << 2;
        *(short *)((long)&pwVar12->content + 4) = (short)uVar17;
        *(ushort *)((long)&pwVar12->content + 6) = (ushort)uVar15;
        for (; AVar21.words = pwVar12 + 1, AVar21.segment = (SegmentBuilder *)local_d8,
            lists.ptr != pLVar14; lists.ptr = lists.ptr + 1) {
          LVar1 = (lists.ptr)->elementCount;
          for (index = 0; LVar1 != index; index = index + 1) {
            f.exception = local_d8;
            ListReader::getStructElement(&local_60,lists.ptr,index);
            other_00.capTable = local_60.capTable;
            other_00.segment = local_60.segment;
            other_00.data = local_60.data;
            other_00.pointers = local_60.pointers;
            other_00.dataSize = local_60.dataSize;
            other_00.pointerCount = local_60.pointerCount;
            other_00._38_2_ = local_60._38_2_;
            other_00.nestingLimit = local_60.nestingLimit;
            other_00._44_4_ = local_60._44_4_;
            StructBuilder::copyContentFrom((StructBuilder *)&f,other_00);
          }
        }
      }
      else {
        uVar16 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                           (uVar16,(anon_class_1_0_00000001 *)&f);
        uVar15 = *(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)elementSize * 4);
        uVar17 = (ulong)uVar16 * (ulong)uVar15 + 0x3f >> 6;
        if (arena == (BuilderArena *)0x0) {
          if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
              (int)(__return_storage_ptr__->tag).content != 0) {
            WireHelpers::zeroObject
                      ((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
          }
          iVar6 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = _DAT_00000028;
          AVar21 = (AllocateResult)(auVar2 << 0x40);
          _DAT_00000028 = _DAT_00000028 + (uVar17 & 0xffffffff) * 8;
        }
        else {
          AVar21 = BuilderArena::allocate(arena,(SegmentWordCount)uVar17);
          iVar6 = -3;
        }
        pwVar12 = AVar21.words;
        local_d8 = (Exception *)AVar21.segment;
        *(int *)&(__return_storage_ptr__->tag).content = iVar6;
        *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) =
             uVar16 << 3 | (uint)elementSize;
        if (elementSize == POINTER) {
          for (; lists.ptr != pLVar14; lists.ptr = lists.ptr + 1) {
            uVar15 = (lists.ptr)->elementCount;
            for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
              f.exception = local_d8;
              uVar4 = (lists.ptr)->segment;
              uVar5 = (lists.ptr)->capTable;
              other.capTable = (CapTableReader *)uVar5;
              other.segment = (SegmentReader *)uVar4;
              other._28_4_ = uStack_6c;
              other.nestingLimit = (lists.ptr)->nestingLimit;
              other.pointer = (WirePointer *)((lists.ptr)->ptr + ((lists.ptr)->step * uVar17 >> 3));
              PointerBuilder::copyFrom((PointerBuilder *)&f,other,false);
            }
          }
        }
        else if (elementSize == 1) {
          uVar15 = 0;
          for (; lists.ptr != pLVar14; lists.ptr = lists.ptr + 1) {
            uVar16 = (lists.ptr)->elementCount;
            uVar17 = 0;
            while( true ) {
              uVar13 = (uint)uVar17;
              uVar10 = uVar15 + uVar13;
              if (uVar16 == uVar13) break;
              bVar9 = (byte)uVar10 & 7;
              *(byte *)((long)&pwVar12->content + (ulong)(uVar10 >> 3)) =
                   (((lists.ptr)->ptr[uVar17 >> 3] >> (uVar13 & 7) & 1) != 0) << bVar9 |
                   *(byte *)((long)&pwVar12->content + (ulong)(uVar10 >> 3)) & ~(byte)(1 << bVar9);
              uVar17 = (ulong)(uVar13 + 1);
            }
            uVar15 = uVar10;
          }
        }
        else {
          pLVar14 = lists.ptr;
          for (lVar7 = 0; lists.size_ * 0x30 - lVar7 != 0; lVar7 = lVar7 + 0x30) {
            uVar18 = (ulong)pLVar14->elementCount * (ulong)(uVar15 >> 3);
            uVar17 = uVar18 & 0xffffffff;
            if (uVar17 != 0) {
              memcpy(pwVar12,*(void **)((long)&(lists.ptr)->ptr + lVar7),uVar17);
            }
            pwVar12 = (word *)((long)&pwVar12->content + uVar18);
            pLVar14 = pLVar14 + 1;
          }
        }
      }
      pwVar19 = AVar21.words;
      local_d8 = (Exception *)AVar21.segment;
      pwVar12 = pwVar19 + -1;
      if (pwVar19 == (word *)0x0) {
        pwVar12 = pwVar19;
      }
      __return_storage_ptr__->segment = (SegmentBuilder *)local_d8;
      __return_storage_ptr__->capTable = capTable;
      if (elementSize != INLINE_COMPOSITE) {
        pwVar12 = pwVar19;
      }
      __return_storage_ptr__->location = pwVar12;
      return __return_storage_ptr__;
    }
    uVar16 = uVar16 + pLVar11->elementCount;
    if (0x1fffffff < uVar16) break;
    if ((pLVar11->elementSize != elementSize) &&
       ((pLVar11->elementSize == BIT ||
        (bVar20 = elementSize == BIT, elementSize = INLINE_COMPOSITE, bVar20)))) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xd64,FAILED,
                 "list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT",
                 "\"can\'t upgrade bit lists to struct lists\"",
                 (char (*) [40])"can\'t upgrade bit lists to struct lists");
      kj::_::Debug::Fault::fatal(&f);
    }
    uVar17 = (ulong)pLVar11->structDataSize + 0x3f >> 6;
    if (uVar17 <= uVar18) {
      uVar17 = uVar18;
    }
    if ((ushort)uVar15 <= pLVar11->structPointerCount) {
      uVar15 = (uint)pLVar11->structPointerCount;
    }
    pLVar11 = pLVar11 + 1;
    lVar7 = lVar7 + -0x30;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xd60,FAILED,(char *)0x0,"\"concatenated list exceeds list size limit\"",
             (char (*) [42])"concatenated list exceeds list size limit");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

OrphanBuilder OrphanBuilder::concat(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementSize elementSize, StructSize structSize,
    kj::ArrayPtr<const ListReader> lists) {
  KJ_REQUIRE(lists.size() > 0, "Can't concat empty list ");

  // Find the overall element count and size.
  ListElementCount elementCount = ZERO * ELEMENTS;
  for (auto& list: lists) {
    elementCount = assertMaxBits<LIST_ELEMENT_COUNT_BITS>(elementCount + list.elementCount,
        []() { KJ_FAIL_REQUIRE("concatenated list exceeds list size limit"); });
    if (list.elementSize != elementSize) {
      // If element sizes don't all match, upgrade to struct list.
      KJ_REQUIRE(list.elementSize != ElementSize::BIT && elementSize != ElementSize::BIT,
                 "can't upgrade bit lists to struct lists");
      elementSize = ElementSize::INLINE_COMPOSITE;
    }
    structSize.data = kj::max(structSize.data,
        WireHelpers::roundBitsUpToWords(list.structDataSize));
    structSize.pointers = kj::max(structSize.pointers, list.structPointerCount);
  }

  // Allocate the list.
  OrphanBuilder result;
  ListBuilder builder = (elementSize == ElementSize::INLINE_COMPOSITE)
      ? WireHelpers::initStructListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, structSize, arena)
      : WireHelpers::initListPointer(
          result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);

  // Copy elements.
  switch (elementSize) {
    case ElementSize::INLINE_COMPOSITE: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getStructElement(pos).copyContentFrom(list.getStructElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::POINTER: {
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.getPointerElement(pos).copyFrom(list.getPointerElement(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    case ElementSize::BIT: {
      // It's difficult to memcpy() bits since a list could start or end mid-byte. For now we
      // do a slow, naive loop. Probably no one will ever care.
      ListElementCount pos = ZERO * ELEMENTS;
      for (auto& list: lists) {
        for (auto i: kj::zeroTo(list.size())) {
          builder.setDataElement<bool>(pos, list.getDataElement<bool>(i));
          // assumeBits() safe because we checked total size earlier.
          pos = assumeBits<LIST_ELEMENT_COUNT_BITS>(pos + ONE * ELEMENTS);
        }
      }
      break;
    }
    default: {
      // We know all the inputs are primitives with identical size because otherwise we would have
      // chosen INLINE_COMPOSITE. Therefore, we can safely use memcpy() here instead of copying
      // each element manually.
      byte* target = builder.ptr;
      auto step = builder.step / BITS_PER_BYTE;
      for (auto& list: lists) {
        auto count = step * upgradeBound<uint64_t>(list.size());
        WireHelpers::copyMemory(target, list.ptr, assumeBits<SEGMENT_WORD_COUNT_BITS>(count));
        target += count;
      }
      break;
    }
  }

  // Return orphan.
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}